

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xpath_variable * __thiscall pugi::xpath_variable_set::find(xpath_variable_set *this,char_t *name)

{
  bool bVar1;
  uint uVar2;
  char_t *src;
  xpath_variable *local_38;
  xpath_variable *var;
  size_t hash;
  size_t hash_size;
  char_t *name_local;
  xpath_variable_set *this_local;
  
  uVar2 = impl::anon_unknown_0::hash_string(name);
  local_38 = this->_data[(ulong)uVar2 & 0x3f];
  while( true ) {
    if (local_38 == (xpath_variable *)0x0) {
      return (xpath_variable *)0x0;
    }
    src = xpath_variable::name(local_38);
    bVar1 = impl::anon_unknown_0::strequal(src,name);
    if (bVar1) break;
    local_38 = local_38->_next;
  }
  return local_38;
}

Assistant:

PUGI__FN xpath_variable* xpath_variable_set::find(const char_t* name) const
	{
		const size_t hash_size = sizeof(_data) / sizeof(_data[0]);
		size_t hash = impl::hash_string(name) % hash_size;

		// look for existing variable
		for (xpath_variable* var = _data[hash]; var; var = var->_next)
			if (impl::strequal(var->name(), name))
				return var;

		return 0;
	}